

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMutex.cpp
# Opt level: O2

void __thiscall de::Mutex::Mutex(Mutex *this,deUint32 flags)

{
  deMutex dVar1;
  undefined8 *puVar2;
  deMutexAttributes local_c;
  
  this->m_mutex = 0;
  local_c.flags = flags;
  dVar1 = deMutex_create(&local_c);
  this->m_mutex = dVar1;
  if (dVar1 != 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = clock_gettime;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Mutex::Mutex (deUint32 flags)
	: m_mutex(0)
{
	deMutexAttributes attribs;
	deMemset(&attribs, 0, sizeof(attribs));
	attribs.flags = flags;

	m_mutex = deMutex_create(&attribs);
	if (!m_mutex)
		throw std::bad_alloc();
}